

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guess_basis.cc
# Opt level: O0

Int ipx::ComputeValues(SparseMatrix *L,SparseMatrix *AI,Int j,Int *rownumber,Int *pattern,Int top,
                      Vector *lhs)

{
  int iVar1;
  int iVar2;
  Int IVar3;
  Int IVar4;
  Int *pIVar5;
  Int *pIVar6;
  double *pdVar7;
  double *pdVar8;
  char *pcVar9;
  long in_RCX;
  int __c;
  SparseMatrix *in_RSI;
  int __x;
  SparseMatrix *in_RDI;
  long in_R8;
  int in_R9D;
  double dVar11;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  valarray<double> *in_stack_00000008;
  Int p_1;
  Int k;
  double temp;
  Int i;
  Int t_1;
  Int imax;
  double lhsmax;
  Int p;
  Int t;
  double *Lx;
  Int *Li;
  Int *Lp;
  Int m;
  Int in_stack_ffffffffffffff5c;
  SparseMatrix *in_stack_ffffffffffffff60;
  double dVar12;
  int local_78;
  int local_60;
  int local_5c;
  double local_58;
  uint local_50;
  int local_4c;
  valarray<double> *pvVar10;
  
  IVar3 = SparseMatrix::rows(in_RDI);
  pIVar5 = SparseMatrix::colptr((SparseMatrix *)0x81f399);
  pIVar6 = SparseMatrix::rowidx((SparseMatrix *)0x81f3ab);
  pdVar7 = SparseMatrix::values((SparseMatrix *)0x81f3bd);
  for (local_4c = in_R9D; local_4c < IVar3; local_4c = local_4c + 1) {
    pdVar8 = std::valarray<double>::operator[]
                       (in_stack_00000008,(long)*(int *)(in_R8 + (long)local_4c * 4));
    *pdVar8 = 0.0;
  }
  for (local_50 = SparseMatrix::begin(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      IVar4 = SparseMatrix::end(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c),
      (int)local_50 < IVar4; local_50 = local_50 + 1) {
    dVar11 = SparseMatrix::value(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    pvVar10 = in_stack_00000008;
    pcVar9 = SparseMatrix::index(in_RSI,(char *)(ulong)local_50,__c);
    pdVar8 = std::valarray<double>::operator[](pvVar10,(long)(int)pcVar9);
    *pdVar8 = dVar11;
  }
  local_58 = 0.0;
  local_5c = -1;
  for (local_60 = in_R9D; local_60 < IVar3; local_60 = local_60 + 1) {
    iVar1 = *(int *)(in_R8 + (long)local_60 * 4);
    pvVar10 = in_stack_00000008;
    pdVar8 = std::valarray<double>::operator[](in_stack_00000008,(long)iVar1);
    __x = (int)pvVar10;
    dVar11 = *pdVar8;
    iVar2 = *(int *)(in_RCX + (long)iVar1 * 4);
    if ((dVar11 != 0.0) || (NAN(dVar11))) {
      if (iVar2 < 0) {
        std::abs(__x);
        if (local_58 < extraout_XMM0_Qa) {
          std::abs(__x);
          local_5c = iVar1;
          local_58 = extraout_XMM0_Qa_00;
        }
      }
      else {
        for (local_78 = pIVar5[iVar2]; local_78 < pIVar5[iVar2 + 1]; local_78 = local_78 + 1) {
          dVar12 = pdVar7[local_78];
          pdVar8 = std::valarray<double>::operator[](in_stack_00000008,(long)pIVar6[local_78]);
          *pdVar8 = -dVar12 * dVar11 + *pdVar8;
        }
      }
    }
  }
  return local_5c;
}

Assistant:

static Int ComputeValues(const SparseMatrix& L, const SparseMatrix& AI,
                         Int j, const Int* rownumber, const Int* pattern,
                         Int top, Vector& lhs){
    const Int m = L.rows();
    const Int* Lp = L.colptr();
    const Int* Li = L.rowidx();
    const double* Lx = L.values();
    for (Int t = top; t < m; t++)
        lhs[pattern[t]] = 0.0;
    for (Int p = AI.begin(j); p < AI.end(j); p++) // scatter RHS into lhs
        lhs[AI.index(p)] = AI.value(p);
    double lhsmax = 0.0;        // maximum entry that has not been pivotal
    Int imax = -1;              // corresponding position in lhs
    for (Int t = top; t < m; t++) {
        Int i = pattern[t];
        double temp = lhs[i];
        Int k = rownumber[i];
        if (temp != 0.0) {
            if (k >= 0) {
                // Row i has been pivotal; update lhs.
                for (Int p = Lp[k]; p < Lp[k+1]; p++)
                    lhs[Li[p]] -= Lx[p] * temp;
            } else if (std::abs(temp) > lhsmax) {
                // Row i has not been pivotal; update lhsmax.
                lhsmax = std::abs(temp);
                imax = i;
            }
        }
    }
    return imax;
}